

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O1

int32_t icu_63::PropNameData::getPropertyValueEnum(int32_t property,char *alias)

{
  int32_t iVar1;
  
  iVar1 = findProperty(property);
  if ((iVar1 != 0) && ((long)*(int *)(valueMaps + (long)iVar1 * 4 + 4) != 0)) {
    iVar1 = getPropertyOrValueEnum
                      (*(int32_t *)(valueMaps + (long)*(int *)(valueMaps + (long)iVar1 * 4 + 4) * 4)
                       ,alias);
    return iVar1;
  }
  return -1;
}

Assistant:

int32_t PropNameData::getPropertyValueEnum(int32_t property, const char *alias) {
    int32_t valueMapIndex=findProperty(property);
    if(valueMapIndex==0) {
        return UCHAR_INVALID_CODE;  // Not a known property.
    }
    valueMapIndex=valueMaps[valueMapIndex+1];
    if(valueMapIndex==0) {
        return UCHAR_INVALID_CODE;  // The property does not have named values.
    }
    // valueMapIndex is the start of the property's valueMap,
    // where the first word is the BytesTrie offset.
    return getPropertyOrValueEnum(valueMaps[valueMapIndex], alias);
}